

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::LogToFile(int max_depth,char *filename)

{
  ImGuiContext *pIVar1;
  FILE *pFVar2;
  long in_RSI;
  int in_EDI;
  ImGuiWindow *window;
  ImGuiContext *g;
  char *in_stack_ffffffffffffffd8;
  ImGuiWindow *filename_00;
  
  pIVar1 = GImGui;
  if (((GImGui->LogEnabled & 1U) == 0) &&
     ((filename_00 = GImGui->CurrentWindow, in_RSI != 0 || ((GImGui->IO).LogFilename != (char *)0x0)
      ))) {
    pFVar2 = ImFileOpen((char *)filename_00,in_stack_ffffffffffffffd8);
    pIVar1->LogFile = pFVar2;
    if (pIVar1->LogFile != (FILE *)0x0) {
      pIVar1->LogEnabled = true;
      pIVar1->LogStartDepth = (filename_00->DC).TreeDepth;
      if (-1 < in_EDI) {
        pIVar1->LogAutoExpandMaxDepth = in_EDI;
      }
    }
  }
  return;
}

Assistant:

void ImGui::LogToFile(int max_depth, const char* filename)
{
    ImGuiContext& g = *GImGui;
    if (g.LogEnabled)
        return;
    ImGuiWindow* window = g.CurrentWindow;

    if (!filename)
    {
        filename = g.IO.LogFilename;
        if (!filename)
            return;
    }

    IM_ASSERT(g.LogFile == NULL);
    g.LogFile = ImFileOpen(filename, "ab");
    if (!g.LogFile)
    {
        IM_ASSERT(g.LogFile != NULL); // Consider this an error
        return;
    }
    g.LogEnabled = true;
    g.LogStartDepth = window->DC.TreeDepth;
    if (max_depth >= 0)
        g.LogAutoExpandMaxDepth = max_depth;
}